

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateProxy_TTD
          (JavascriptLibrary *this,RecyclableObject *handler,RecyclableObject *target)

{
  bool bVar1;
  Recycler *alloc;
  JavascriptProxy *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&JavascriptProxy::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x15bb;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_50);
  this_00 = (JavascriptProxy *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  JavascriptProxy::JavascriptProxy
            (this_00,(this->proxyType).ptr,(this->super_JavascriptLibraryBase).scriptContext.ptr,
             target,handler);
  if (target != (RecyclableObject *)0x0) {
    bVar1 = JavascriptConversion::IsCallable(target);
    if (bVar1) {
      DynamicObject::ChangeType((DynamicObject *)this_00);
      ((this_00->super_DynamicObject).super_RecyclableObject.type.ptr)->entryPoint =
           JavascriptProxy::FunctionCallTrap;
    }
  }
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateProxy_TTD(RecyclableObject* handler, RecyclableObject* target)
    {
        JavascriptProxy* newProxy = RecyclerNew(this->scriptContext->GetRecycler(), JavascriptProxy, this->GetProxyType(), this->scriptContext, target, handler);

        if(target != nullptr && JavascriptConversion::IsCallable(target))
        {
            newProxy->ChangeType();
            newProxy->GetDynamicType()->SetEntryPoint(JavascriptProxy::FunctionCallTrap);
        }

        return newProxy;
    }